

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS
ref_cavity_form_edge_collapse(REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_ADJ pRVar3;
  REF_INT *pRVar4;
  REF_DBL *pRVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  REF_STATUS RVar9;
  REF_ADJ_ITEM pRVar10;
  REF_INT *pRVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  char *pcVar18;
  REF_INT RVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  REF_BOOL already_have_it;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  
  pRVar1 = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node0;
  iVar8 = pRVar1->ref_mpi->id;
  if ((iVar8 == pRVar1->part[node0]) && (iVar8 == pRVar1->part[node1])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      ref_cavity->collapse_node0 = node0;
      ref_cavity->collapse_node1 = node1;
      pRVar2 = ref_grid->cell[8];
      uVar13 = 0xffffffff;
      RVar19 = -1;
      if (-1 < node0) {
        pRVar3 = pRVar2->ref_adj;
        uVar13 = 0xffffffff;
        RVar19 = -1;
        if (node0 < pRVar3->nnode) {
          uVar7 = pRVar3->first[node0];
          uVar13 = 0xffffffff;
          RVar19 = -1;
          if ((long)(int)uVar7 != -1) {
            RVar19 = pRVar3->item[(int)uVar7].ref;
            uVar13 = (ulong)uVar7;
          }
        }
      }
      do {
        if ((int)uVar13 == -1) {
          RVar19 = -1;
          iVar8 = -1;
          if (node1 < 0) goto LAB_001be5d7;
          pRVar3 = pRVar2->ref_adj;
          RVar19 = -1;
          if (pRVar3->nnode <= node1) goto LAB_001be5d7;
          iVar12 = pRVar3->first[node1];
          RVar19 = -1;
          iVar8 = -1;
          if (iVar12 == -1) goto LAB_001be5d7;
          pRVar10 = pRVar3->item;
          do {
            RVar19 = pRVar10[iVar12].ref;
            iVar8 = iVar12;
LAB_001be5d7:
            do {
              if (iVar8 == -1) {
                pRVar2 = ref_grid->cell[3];
                RVar19 = -1;
                uVar13 = 0xffffffff;
                if (-1 < node0) {
                  pRVar3 = pRVar2->ref_adj;
                  uVar13 = 0xffffffff;
                  if (node0 < pRVar3->nnode) {
                    uVar7 = pRVar3->first[node0];
                    uVar13 = 0xffffffff;
                    if ((long)(int)uVar7 != -1) {
                      RVar19 = pRVar3->item[(int)uVar7].ref;
                      uVar13 = (ulong)uVar7;
                    }
                  }
                }
                goto LAB_001be80d;
              }
              uVar7 = ref_list_contains(ref_cavity->tet_list,RVar19,&already_have_it);
              if (uVar7 != 0) {
                uVar13 = (ulong)uVar7;
                pcVar18 = "have tet?";
                uVar14 = 0x618;
                goto LAB_001bee3d;
              }
              if (already_have_it == 0) {
                uVar7 = ref_list_push(ref_cavity->tet_list,RVar19);
                if (uVar7 != 0) {
                  uVar13 = (ulong)uVar7;
                  pcVar18 = "save tet";
                  uVar14 = 0x61a;
                  goto LAB_001bee3d;
                }
                bVar22 = false;
                iVar12 = pRVar2->node_per;
                if (pRVar2->node_per < 1) {
                  iVar12 = 0;
                }
                bVar21 = false;
                iVar16 = 0;
                while (iVar12 != iVar16) {
                  pRVar11 = pRVar2->c2n;
                  bVar6 = !bVar21;
                  bVar21 = true;
                  if (bVar6) {
                    bVar21 = pRVar11[pRVar2->size_per * RVar19 + iVar16] == node0;
                  }
                  iVar17 = pRVar2->size_per * RVar19 + iVar16;
                  bVar6 = !bVar22;
                  bVar22 = true;
                  if (bVar6) {
                    bVar22 = pRVar11[iVar17] == node1;
                  }
                  iVar16 = iVar16 + 1;
                  if (pRVar1->ref_mpi->id != pRVar1->part[pRVar11[iVar17]]) goto LAB_001bec9c;
                }
                if (!(bool)(bVar21 & bVar22)) {
                  for (lVar20 = 0; lVar20 < pRVar2->face_per; lVar20 = lVar20 + 1) {
                    pRVar11 = pRVar2->c2n;
                    iVar12 = pRVar2->size_per;
                    pRVar4 = pRVar2->f2n;
                    bVar22 = false;
                    for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
                      iVar16 = pRVar11[(long)pRVar4[(ulong)((uint)lVar20 & 0x3fffffff) * 4 + lVar15]
                                       + (long)iVar12 * (long)RVar19];
                      face_nodes[lVar15] = iVar16;
                      bVar22 = iVar16 == node1 || bVar22;
                    }
                    if ((!bVar22) &&
                       (uVar7 = ref_cavity_insert_face(ref_cavity,face_nodes), uVar7 != 0)) {
                      uVar13 = (ulong)uVar7;
                      pcVar18 = "tet face";
                      uVar14 = 0x62e;
                      goto LAB_001bee3d;
                    }
                  }
                }
              }
              pRVar10 = pRVar2->ref_adj->item;
              iVar12 = pRVar10[iVar8].next;
              RVar19 = -1;
              iVar8 = iVar12;
            } while (iVar12 == -1);
          } while( true );
        }
        uVar7 = ref_list_contains(ref_cavity->tet_list,RVar19,&already_have_it);
        if (uVar7 != 0) {
          uVar13 = (ulong)uVar7;
          pcVar18 = "have tet?";
          uVar14 = 0x5fb;
          goto LAB_001bee3d;
        }
        if (already_have_it == 0) {
          uVar7 = ref_list_push(ref_cavity->tet_list,RVar19);
          if (uVar7 != 0) {
            uVar13 = (ulong)uVar7;
            pcVar18 = "save tet";
            uVar14 = 0x5fd;
            goto LAB_001bee3d;
          }
          bVar22 = false;
          iVar8 = pRVar2->node_per;
          if (pRVar2->node_per < 1) {
            iVar8 = 0;
          }
          bVar21 = false;
          iVar12 = 0;
          while (iVar8 != iVar12) {
            pRVar11 = pRVar2->c2n;
            bVar6 = !bVar21;
            bVar21 = true;
            if (bVar6) {
              bVar21 = pRVar11[pRVar2->size_per * RVar19 + iVar12] == node0;
            }
            iVar16 = pRVar2->size_per * RVar19 + iVar12;
            bVar6 = !bVar22;
            bVar22 = true;
            if (bVar6) {
              bVar22 = pRVar11[iVar16] == node1;
            }
            iVar12 = iVar12 + 1;
            if (pRVar1->ref_mpi->id != pRVar1->part[pRVar11[iVar16]]) {
LAB_001bec9c:
              ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
              return 0;
            }
          }
          if (!(bool)(bVar21 & bVar22)) {
            for (lVar20 = 0; lVar20 < pRVar2->face_per; lVar20 = lVar20 + 1) {
              pRVar11 = pRVar2->c2n;
              iVar8 = pRVar2->size_per;
              pRVar4 = pRVar2->f2n;
              bVar22 = false;
              for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
                iVar12 = pRVar11[(long)pRVar4[(ulong)((uint)lVar20 & 0x3fffffff) * 4 + lVar15] +
                                 (long)iVar8 * (long)RVar19];
                face_nodes[lVar15] = iVar12;
                bVar22 = iVar12 == node0 || bVar22;
              }
              if ((!bVar22) && (uVar7 = ref_cavity_insert_face(ref_cavity,face_nodes), uVar7 != 0))
              {
                uVar13 = (ulong)uVar7;
                pcVar18 = "tet face";
                uVar14 = 0x611;
                goto LAB_001bee3d;
              }
            }
          }
        }
        pRVar10 = pRVar2->ref_adj->item;
        uVar13 = (ulong)pRVar10[(int)uVar13].next;
        RVar19 = -1;
        if (uVar13 != 0xffffffffffffffff) {
          RVar19 = pRVar10[uVar13].ref;
        }
      } while( true );
    }
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
  }
  else {
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
LAB_001be80d:
  if ((int)uVar13 == -1) {
    RVar19 = -1;
    iVar8 = -1;
    if (node1 < 0) goto LAB_001beab4;
    pRVar3 = pRVar2->ref_adj;
    RVar19 = -1;
    if (pRVar3->nnode <= node1) goto LAB_001beab4;
    iVar12 = pRVar3->first[node1];
    RVar19 = -1;
    iVar8 = -1;
    if (iVar12 == -1) goto LAB_001beab4;
    pRVar10 = pRVar3->item;
    do {
      RVar19 = pRVar10[iVar12].ref;
      iVar8 = iVar12;
LAB_001beab4:
      do {
        if (iVar8 == -1) {
          RVar9 = ref_cavity_verify_face_manifold(ref_cavity);
          if (RVar9 == 0) {
            RVar9 = ref_cavity_verify_seg_manifold(ref_cavity);
            if (RVar9 == 0) {
              return 0;
            }
            pcVar18 = "collapse seg manifold";
            uVar14 = 0x691;
          }
          else {
            pcVar18 = "collapse face manifold";
            uVar14 = 0x68b;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar14,"ref_cavity_form_edge_collapse",1,pcVar18);
          pRVar5 = pRVar1->real;
          lVar20 = (long)ref_cavity->node;
          printf("at %f %f %f\n",pRVar5[lVar20 * 0xf],pRVar5[lVar20 * 0xf + 1],
                 pRVar5[lVar20 * 0xf + 2]);
          return 1;
        }
        uVar7 = ref_list_contains(ref_cavity->tri_list,RVar19,&already_have_it);
        if (uVar7 != 0) {
          uVar13 = (ulong)uVar7;
          pcVar18 = "have tet?";
          uVar14 = 0x660;
          goto LAB_001bee3d;
        }
        if (already_have_it == 0) {
          uVar7 = ref_list_push(ref_cavity->tri_list,RVar19);
          if (uVar7 != 0) {
            uVar13 = (ulong)uVar7;
            pcVar18 = "save tri";
            uVar14 = 0x662;
            goto LAB_001bee3d;
          }
          bVar22 = false;
          iVar12 = pRVar2->node_per;
          if (pRVar2->node_per < 1) {
            iVar12 = 0;
          }
          bVar21 = false;
          iVar16 = 0;
          while (iVar12 != iVar16) {
            pRVar11 = pRVar2->c2n;
            bVar6 = !bVar21;
            bVar21 = true;
            if (bVar6) {
              bVar21 = pRVar11[pRVar2->size_per * RVar19 + iVar16] == node0;
            }
            iVar17 = pRVar2->size_per * RVar19 + iVar16;
            bVar6 = !bVar22;
            bVar22 = true;
            if (bVar6) {
              bVar22 = pRVar11[iVar17] == node1;
            }
            iVar16 = iVar16 + 1;
            if (pRVar1->ref_mpi->id != pRVar1->part[pRVar11[iVar17]]) goto LAB_001bec9c;
          }
          if (!(bool)(bVar21 & bVar22)) {
            pRVar11 = pRVar2->c2n;
            lVar15 = (long)RVar19;
            lVar20 = pRVar2->size_per * lVar15;
            if ((pRVar11[lVar20] != node1) && (pRVar11[lVar20 + 1] != node1)) {
              seg_nodes[2] = pRVar11[lVar20 + 3];
              seg_nodes[0] = pRVar11[lVar20];
              seg_nodes[1] = pRVar11[lVar20 + 1];
              uVar7 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
              if (uVar7 != 0) {
                uVar13 = (ulong)uVar7;
                pcVar18 = "tri 1 side 01";
                uVar14 = 0x674;
                goto LAB_001bee3d;
              }
              pRVar11 = pRVar2->c2n;
              lVar20 = pRVar2->size_per * lVar15;
            }
            if ((pRVar11[lVar20 + 1] != node1) && (pRVar11[lVar20 + 2] != node1)) {
              seg_nodes[2] = pRVar11[lVar20 + 3];
              seg_nodes[0] = pRVar11[lVar20 + 1];
              seg_nodes[1] = pRVar11[lVar20 + 2];
              uVar7 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
              if (uVar7 != 0) {
                uVar13 = (ulong)uVar7;
                pcVar18 = "tri 1 side 12";
                uVar14 = 0x67b;
                goto LAB_001bee3d;
              }
              pRVar11 = pRVar2->c2n;
              lVar20 = pRVar2->size_per * lVar15;
            }
            if ((pRVar11[lVar20 + 2] != node1) && (pRVar11[lVar20] != node1)) {
              seg_nodes[2] = pRVar11[lVar20 + 3];
              seg_nodes[0] = pRVar11[lVar20 + 2];
              seg_nodes[1] = pRVar11[lVar20];
              uVar7 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
              if (uVar7 != 0) {
                uVar13 = (ulong)uVar7;
                pcVar18 = "tri 1 side 20";
                uVar14 = 0x682;
                goto LAB_001bee3d;
              }
            }
          }
        }
        pRVar10 = pRVar2->ref_adj->item;
        iVar12 = pRVar10[iVar8].next;
        RVar19 = -1;
        iVar8 = iVar12;
      } while (iVar12 == -1);
    } while( true );
  }
  uVar7 = ref_list_contains(ref_cavity->tri_list,RVar19,&already_have_it);
  if (uVar7 != 0) {
    uVar13 = (ulong)uVar7;
    pcVar18 = "have tet?";
    uVar14 = 0x637;
    goto LAB_001bee3d;
  }
  if (already_have_it == 0) {
    uVar7 = ref_list_push(ref_cavity->tri_list,RVar19);
    if (uVar7 != 0) {
      uVar13 = (ulong)uVar7;
      pcVar18 = "save tri";
      uVar14 = 0x639;
LAB_001bee3d:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar14,"ref_cavity_form_edge_collapse",uVar13,pcVar18);
      return (REF_STATUS)uVar13;
    }
    bVar22 = false;
    iVar8 = pRVar2->node_per;
    if (pRVar2->node_per < 1) {
      iVar8 = 0;
    }
    bVar21 = false;
    iVar12 = 0;
    while (iVar8 != iVar12) {
      pRVar11 = pRVar2->c2n;
      bVar6 = !bVar21;
      bVar21 = true;
      if (bVar6) {
        bVar21 = pRVar11[pRVar2->size_per * RVar19 + iVar12] == node0;
      }
      iVar16 = pRVar2->size_per * RVar19 + iVar12;
      bVar6 = !bVar22;
      bVar22 = true;
      if (bVar6) {
        bVar22 = pRVar11[iVar16] == node1;
      }
      iVar12 = iVar12 + 1;
      if (pRVar1->ref_mpi->id != pRVar1->part[pRVar11[iVar16]]) goto LAB_001bec9c;
    }
    if (!(bool)(bVar21 & bVar22)) {
      pRVar11 = pRVar2->c2n;
      lVar15 = (long)RVar19;
      lVar20 = pRVar2->size_per * lVar15;
      if ((pRVar11[lVar20] != node0) && (pRVar11[lVar20 + 1] != node0)) {
        seg_nodes[2] = pRVar11[lVar20 + 3];
        seg_nodes[0] = pRVar11[lVar20];
        seg_nodes[1] = pRVar11[lVar20 + 1];
        uVar7 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
        if (uVar7 != 0) {
          uVar13 = (ulong)uVar7;
          pcVar18 = "tri 0 side 01";
          uVar14 = 0x64b;
          goto LAB_001bee3d;
        }
        pRVar11 = pRVar2->c2n;
        lVar20 = pRVar2->size_per * lVar15;
      }
      if ((pRVar11[lVar20 + 1] != node0) && (pRVar11[lVar20 + 2] != node0)) {
        seg_nodes[2] = pRVar11[lVar20 + 3];
        seg_nodes[0] = pRVar11[lVar20 + 1];
        seg_nodes[1] = pRVar11[lVar20 + 2];
        uVar7 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
        if (uVar7 != 0) {
          uVar13 = (ulong)uVar7;
          pcVar18 = "tri 0 side 12";
          uVar14 = 0x652;
          goto LAB_001bee3d;
        }
        pRVar11 = pRVar2->c2n;
        lVar20 = pRVar2->size_per * lVar15;
      }
      if ((pRVar11[lVar20 + 2] != node0) && (pRVar11[lVar20] != node0)) {
        seg_nodes[2] = pRVar11[lVar20 + 3];
        seg_nodes[0] = pRVar11[lVar20 + 2];
        seg_nodes[1] = pRVar11[lVar20];
        uVar7 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
        if (uVar7 != 0) {
          uVar13 = (ulong)uVar7;
          pcVar18 = "tri 0 side 20";
          uVar14 = 0x659;
          goto LAB_001bee3d;
        }
      }
    }
  }
  pRVar10 = pRVar2->ref_adj->item;
  uVar13 = (ulong)pRVar10[(int)uVar13].next;
  RVar19 = -1;
  if (uVar13 != 0xffffffffffffffff) {
    RVar19 = pRVar10[uVar13].ref;
  }
  goto LAB_001be80d;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_collapse(REF_CAVITY ref_cavity,
                                                 REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell;

  REF_INT cell_face;
  REF_INT node, face_nodes[3], seg_nodes[3];
  REF_BOOL will_be_collapsed, already_have_it;
  REF_BOOL has_node0, has_node1;

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node0), "init form empty");
  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity->collapse_node0 = node0;
  ref_cavity->collapse_node1 = node1;

  ref_cell = ref_grid_tet(ref_grid);

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    each_ref_cell_cell_face(ref_cell, cell_face) {
      has_node0 = REF_FALSE;
      each_ref_cavity_face_node(ref_cavity, node) {
        face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        has_node0 = has_node0 || (node0 == face_nodes[node]);
      }
      if (!has_node0)
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet face");
    }
  }

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    each_ref_cell_cell_face(ref_cell, cell_face) {
      has_node1 = REF_FALSE;
      each_ref_cavity_face_node(ref_cavity, node) {
        face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        has_node1 = has_node1 || (node1 == face_nodes[node]);
      }
      if (!has_node1)
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet face");
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    if (node0 != ref_cell_c2n(ref_cell, 0, cell) &&
        node0 != ref_cell_c2n(ref_cell, 1, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 01");
    }
    if (node0 != ref_cell_c2n(ref_cell, 1, cell) &&
        node0 != ref_cell_c2n(ref_cell, 2, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 12");
    }
    if (node0 != ref_cell_c2n(ref_cell, 2, cell) &&
        node0 != ref_cell_c2n(ref_cell, 0, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 20");
    }
  }

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    if (node1 != ref_cell_c2n(ref_cell, 0, cell) &&
        node1 != ref_cell_c2n(ref_cell, 1, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 01");
    }
    if (node1 != ref_cell_c2n(ref_cell, 1, cell) &&
        node1 != ref_cell_c2n(ref_cell, 2, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 12");
    }
    if (node1 != ref_cell_c2n(ref_cell, 2, cell) &&
        node1 != ref_cell_c2n(ref_cell, 0, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 20");
    }
  }

  RSB(ref_cavity_verify_face_manifold(ref_cavity), "collapse face manifold", {
    printf("at %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });
  RSB(ref_cavity_verify_seg_manifold(ref_cavity), "collapse seg manifold", {
    printf("at %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });

  return REF_SUCCESS;
}